

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac.c
# Opt level: O3

void cf_hmac_init(cf_hmac_ctx *ctx,cf_chash *hash,uint8_t *key,size_t nkey)

{
  ulong uVar1;
  size_t sVar2;
  size_t sVar3;
  uint8_t k [128];
  uint8_t blk [128];
  byte local_128 [128];
  byte local_a8 [128];
  
  if ((ctx == (cf_hmac_ctx *)0x0) || (hash == (cf_chash *)0x0)) {
LAB_0010b621:
    abort();
  }
  memset(ctx,0,0x2d8);
  ctx->hash = hash;
  sVar3 = hash->blocksz;
  if (sVar3 < nkey) {
    if (sVar3 < hash->hashsz) goto LAB_0010b621;
    cf_hash(hash,key,nkey,local_128);
    nkey = hash->hashsz;
    sVar3 = hash->blocksz;
  }
  else if (local_128 != key) {
    memcpy(local_128,key,nkey);
  }
  if (sVar3 < nkey || sVar3 - nkey == 0) {
    if (sVar3 == 0) goto LAB_0010b583;
  }
  else {
    memset(local_128 + nkey,0,sVar3 - nkey);
  }
  uVar1 = 0;
  do {
    local_a8[uVar1] = local_128[uVar1] ^ 0x36;
    uVar1 = uVar1 + 1;
  } while (sVar3 != uVar1);
LAB_0010b583:
  (*hash->init)(&ctx->inner);
  (*hash->update)(&ctx->inner,local_a8,hash->blocksz);
  sVar3 = hash->blocksz;
  if (sVar3 != 0) {
    sVar2 = 0;
    do {
      local_a8[sVar2] = local_128[sVar2] ^ 0x5c;
      sVar2 = sVar2 + 1;
    } while (sVar3 != sVar2);
  }
  (*hash->init)(&ctx->outer);
  (*hash->update)(&ctx->outer,local_a8,hash->blocksz);
  return;
}

Assistant:

void cf_hmac_init(cf_hmac_ctx *ctx,
                  const cf_chash *hash,
                  const uint8_t *key, size_t nkey)
{
  assert(ctx);
  assert(hash);

  mem_clean(ctx, sizeof *ctx);
  ctx->hash = hash;

  /* Prepare key: */
  uint8_t k[CF_CHASH_MAXBLK];

  /* Shorten long keys. */
  if (nkey > hash->blocksz)
  {
    /* Standard doesn't cover case where blocksz < hashsz.
     * FIPS186-1 seems to want to append a negative number of zero bytes.
     * In any case, we only have a k buffer of CF_CHASH_MAXBLK! */
    assert(hash->hashsz <= hash->blocksz);

    cf_hash(hash, key, nkey, k);
    key = k;
    nkey = hash->hashsz;
  }

  /* Right zero-pad short keys. */
  if (k != key)
    memcpy(k, key, nkey);
  if (hash->blocksz > nkey)
    memset(k + nkey, 0, hash->blocksz - nkey);

  /* Start inner hash computation */
  uint8_t blk[CF_CHASH_MAXBLK];

  xor_b8(blk, k, 0x36, hash->blocksz);
  hash->init(&ctx->inner);
  hash->update(&ctx->inner, blk, hash->blocksz);

  /* And outer. */
  xor_b8(blk, k, 0x5c, hash->blocksz);
  hash->init(&ctx->outer);
  hash->update(&ctx->outer, blk, hash->blocksz);

  mem_clean(blk, sizeof blk);
  mem_clean(k, sizeof k);
}